

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
SetInstance::op_contains
          (SetInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  size_type sVar2;
  undefined8 *puVar3;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RSI;
  string *in_RDI;
  shared_ptr<Instance> instance;
  set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_ffffffffffffff68;
  key_type *in_stack_ffffffffffffff70;
  set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_ffffffffffffff78;
  allocator *paVar5;
  allocator local_49;
  _Self local_48 [3];
  _Self local_30 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  string *type;
  
  local_18 = in_RDX;
  type = in_RDI;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  get_shared_instance((string *)type,in_RSI);
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
       ::find(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar1 = std::operator!=(local_30,local_48);
  pcVar4 = "false";
  if (bVar1) {
    pcVar4 = "true";
  }
  paVar5 = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar4,paVar5);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c2c53);
  return in_RDI;
}

Assistant:

std::string SetInstance::op_contains(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    return (_value.find(instance) != _value.end()) ? "true" : "false";
}